

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_rectpack.h
# Opt level: O0

int stbrp__skyline_find_min_y(stbrp_context *c,stbrp_node *first,int x0,int width,int *pwaste)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  ushort *in_RSI;
  int *in_R8;
  int under_width;
  int waste_area;
  int visited_width;
  int min_y;
  int x1;
  stbrp_node *node;
  int local_3c;
  int local_38;
  int local_34;
  uint local_30;
  ushort *local_28;
  
  if (in_EDX < (int)(uint)*in_RSI) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_rectpack.h"
                ,0x12f,"stbrp__skyline_find_min_y","ImGui ASSERT FAILED: %s","first->x <= x0");
  }
  if ((int)(uint)**(ushort **)(in_RSI + 4) <= in_EDX) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_rectpack.h"
                ,0x136,"stbrp__skyline_find_min_y","ImGui ASSERT FAILED: %s","node->next->x > x0");
  }
  if (in_EDX < (int)(uint)*in_RSI) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_rectpack.h"
                ,0x139,"stbrp__skyline_find_min_y","ImGui ASSERT FAILED: %s","node->x <= x0");
  }
  local_30 = 0;
  local_38 = 0;
  local_34 = 0;
  for (local_28 = in_RSI; (int)(uint)*local_28 < in_EDX + in_ECX;
      local_28 = *(ushort **)(local_28 + 4)) {
    if (local_30 < local_28[1]) {
      iVar1 = local_34 * (local_28[1] - local_30);
      local_30 = (uint)local_28[1];
      if ((int)(uint)*local_28 < in_EDX) {
        local_3c = (uint)**(ushort **)(local_28 + 4) - in_EDX;
      }
      else {
        local_3c = (uint)**(ushort **)(local_28 + 4) - (uint)*local_28;
      }
    }
    else {
      local_3c = (uint)**(ushort **)(local_28 + 4) - (uint)*local_28;
      if (in_ECX < local_3c + local_34) {
        local_3c = in_ECX - local_34;
      }
      iVar1 = local_3c * (local_30 - local_28[1]);
    }
    local_34 = local_3c + local_34;
    local_38 = iVar1 + local_38;
  }
  *in_R8 = local_38;
  return local_30;
}

Assistant:

static int stbrp__skyline_find_min_y(stbrp_context *c, stbrp_node *first, int x0, int width, int *pwaste)
{
   stbrp_node *node = first;
   int x1 = x0 + width;
   int min_y, visited_width, waste_area;

   STBRP__NOTUSED(c);

   STBRP_ASSERT(first->x <= x0);

   #if 0
   // skip in case we're past the node
   while (node->next->x <= x0)
      ++node;
   #else
   STBRP_ASSERT(node->next->x > x0); // we ended up handling this in the caller for efficiency
   #endif

   STBRP_ASSERT(node->x <= x0);

   min_y = 0;
   waste_area = 0;
   visited_width = 0;
   while (node->x < x1) {
      if (node->y > min_y) {
         // raise min_y higher.
         // we've accounted for all waste up to min_y,
         // but we'll now add more waste for everything we've visted
         waste_area += visited_width * (node->y - min_y);
         min_y = node->y;
         // the first time through, visited_width might be reduced
         if (node->x < x0)
            visited_width += node->next->x - x0;
         else
            visited_width += node->next->x - node->x;
      } else {
         // add waste area
         int under_width = node->next->x - node->x;
         if (under_width + visited_width > width)
            under_width = width - visited_width;
         waste_area += under_width * (min_y - node->y);
         visited_width += under_width;
      }
      node = node->next;
   }

   *pwaste = waste_area;
   return min_y;
}